

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O3

PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> * __thiscall
spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::operator++
          (PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *this)

{
  _Elt_pointer ppVar1;
  pointer ppDVar2;
  pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>
  local_28;
  
  if (this->current_ != (NodePtr)0x0) {
    ppVar1 = (this->parent_iterators_).c.
             super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar1 == (this->parent_iterators_).c.
                  super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      this->current_ = (NodePtr)0x0;
    }
    else {
      if (ppVar1 == (this->parent_iterators_).c.
                    super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar1 = (this->parent_iterators_).c.
                 super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      ppDVar2 = ppVar1[-1].second._M_current;
      if (ppDVar2 ==
          ((ppVar1[-1].first)->children_).
          super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this->current_ = ppVar1[-1].first;
        std::
        deque<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
        ::pop_back(&(this->parent_iterators_).c);
      }
      else {
        local_28.first = *ppDVar2;
        this->current_ = local_28.first;
        ppVar1[-1].second._M_current = ppDVar2 + 1;
        ppDVar2 = ((local_28.first)->children_).
                  super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppDVar2 !=
            ((local_28.first)->children_).
            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_28.second._M_current = ppDVar2 + 1;
            std::
            deque<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>,std::allocator<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>>>
            ::
            emplace_back<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>>
                      ((deque<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>,std::allocator<std::pair<spvtools::opt::DominatorTreeNode*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>>>
                        *)&this->parent_iterators_,&local_28);
            local_28.first =
                 *(this->current_->children_).
                  super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            this->current_ = local_28.first;
            ppDVar2 = ((local_28.first)->children_).
                      super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (ppDVar2 !=
                   ((local_28.first)->children_).
                   super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
    }
  }
  return this;
}

Assistant:

PostOrderTreeDFIterator& operator++() {
    MoveToNextNode();
    return *this;
  }